

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__stencil_clear____byte
          (ColladaParserAutoGen14Private *this)

{
  ParserChar **buffer;
  ColladaParserAutoGen14 *pCVar1;
  sint8 sVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined1 uVar5;
  bool failed;
  
  failed = SUB81((ulong)in_RAX >> 0x38,0);
  buffer = &(this->
            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
            ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  sVar2 = GeneratedSaxParser::Utils::toSint8
                    (buffer,(this->
                            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                            ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack,&failed);
  if (failed == false) {
    pCVar1 = (this->
             super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
             ).mImpl;
    iVar4 = (*pCVar1->_vptr_ColladaParserAutoGen14[0x2e0])(pCVar1,(ulong)(uint)(int)sVar2);
    uVar5 = (undefined1)iVar4;
  }
  else {
    bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                      ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                       ERROR_TEXTDATA_PARSING_FAILED,0xcf66212,(ParserChar *)0x0,
                       (this->
                       super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData);
    uVar5 = !bVar3;
  }
  if (*buffer != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  *buffer = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return (bool)uVar5;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__stencil_clear____byte()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__stencil_clear____byte();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
sint8 parameter = GeneratedSaxParser::Utils::toSint8((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__stencil_clear____byte(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_STENCIL_CLEAR, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}